

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O2

void __thiscall webfront::fs::File::~File(File *this)

{
  std::ifstream::~ifstream(&this->fstream);
  std::__cxx11::string::~string((string *)&this->encoding);
  return;
}

Assistant:

File(EncodedData auto t) : File(decltype(t)::data, decltype(t)::dataSize, decltype(t)::encoding) {}